

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratedFileStream.cxx
# Opt level: O3

void __thiscall cmGeneratedFileStreamBase::Open(cmGeneratedFileStreamBase *this,char *name)

{
  char *pcVar1;
  string *source;
  string dir;
  string local_38;
  
  pcVar1 = (char *)(this->Name)._M_string_length;
  strlen(name);
  std::__cxx11::string::_M_replace((ulong)this,0,pcVar1,(ulong)name);
  pcVar1 = (char *)(this->TempName)._M_string_length;
  source = &this->TempName;
  strlen(name);
  std::__cxx11::string::_M_replace((ulong)source,0,pcVar1,(ulong)name);
  std::__cxx11::string::append((char *)source);
  cmsys::SystemTools::RemoveFile(source);
  cmsys::SystemTools::GetFilenamePath(&local_38,source);
  cmsys::SystemTools::MakeDirectory(local_38._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmGeneratedFileStreamBase::Open(const char* name)
{
  // Save the original name of the file.
  this->Name = name;

  // Create the name of the temporary file.
  this->TempName = name;
#if defined(__VMS)
  this->TempName += "_tmp";
#else
  this->TempName += ".tmp";
#endif

  // Make sure the temporary file that will be used is not present.
  cmSystemTools::RemoveFile(this->TempName);

  std::string dir = cmSystemTools::GetFilenamePath(this->TempName);
  cmSystemTools::MakeDirectory(dir.c_str());
}